

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int test_symlink_dir_impl(int type)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uv_loop_t *puVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *pcVar7;
  uv_dirent_t dent_00;
  uv_dirent_t dent_01;
  uv_dirent_t dent;
  size_t test_dir_abs_size;
  uv_fs_t req;
  
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");
  rmdir("test_dir_symlink");
  test_dir_abs_size = 0x400;
  loop = uv_default_loop();
  uv_fs_mkdir((uv_loop_t *)0x0,&req,"test_dir",0x1ff,(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&req);
  uv_cwd(test_symlink_dir_impl::test_dir_abs_buf,&test_dir_abs_size);
  sVar3 = strlen(test_symlink_dir_impl::test_dir_abs_buf);
  builtin_strncpy(test_symlink_dir_impl::test_dir_abs_buf + sVar3,"/test_di",8);
  (test_symlink_dir_impl::test_dir_abs_buf + sVar3 + 8)[0] = 'r';
  (test_symlink_dir_impl::test_dir_abs_buf + sVar3 + 8)[1] = '\0';
  test_dir_abs_size = test_dir_abs_size + 9;
  uVar1 = uv_fs_symlink((uv_loop_t *)0x0,&req,"test_dir","test_dir_symlink",type,(uv_fs_cb)0x0);
  if ((type == 1) && ((uVar1 == 0xffffffff || (uVar1 == 0xffffffa1)))) {
    uv_fs_req_cleanup(&req);
    fprintf(_stderr,"%s\n",
            "this version of Windows doesn\'t support unprivileged creation of directory symlinks");
    fflush(_stderr);
    return 1;
  }
  fprintf(_stderr,"r == %i\n",(ulong)uVar1);
  if (uVar1 == 0) {
    if (req.result == 0) {
      uv_fs_req_cleanup(&req);
      iVar2 = uv_fs_stat((uv_loop_t *)0x0,&req,"test_dir_symlink",(uv_fs_cb)0x0);
      if (iVar2 == 0) {
        if ((*(byte *)((long)req.ptr + 9) & 0x40) == 0) {
          pcVar7 = "((uv_stat_t*)req.ptr)->st_mode & S_IFDIR";
          uVar5 = 0x8ac;
        }
        else {
          uv_fs_req_cleanup(&req);
          iVar2 = uv_fs_lstat((uv_loop_t *)0x0,&req,"test_dir_symlink",(uv_fs_cb)0x0);
          if (iVar2 == 0) {
            if ((*(byte *)((long)req.ptr + 9) & 0xa0) == 0) {
              pcVar7 = "((uv_stat_t*)req.ptr)->st_mode & S_IFLNK";
              uVar5 = 0x8b4;
            }
            else if (*(long *)((long)req.ptr + 0x38) == 8) {
              uv_fs_req_cleanup(&req);
              iVar2 = uv_fs_readlink((uv_loop_t *)0x0,&req,"test_dir_symlink",(uv_fs_cb)0x0);
              if (iVar2 == 0) {
                iVar2 = strcmp((char *)req.ptr,"test_dir");
                if (iVar2 == 0) {
                  uv_fs_req_cleanup(&req);
                  iVar2 = uv_fs_realpath((uv_loop_t *)0x0,&req,"test_dir_symlink",(uv_fs_cb)0x0);
                  if (iVar2 == 0) {
                    iVar2 = strcmp((char *)req.ptr,test_symlink_dir_impl::test_dir_abs_buf);
                    if (iVar2 == 0) {
                      uv_fs_req_cleanup(&req);
                      iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file1",0x41,0x180,
                                         (uv_fs_cb)0x0);
                      if (iVar2 < 0) {
                        pcVar7 = "r >= 0";
                        uVar5 = 0x8df;
                      }
                      else {
                        uv_fs_req_cleanup(&open_req1);
                        iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,
                                            (uv_fs_cb)0x0);
                        if (iVar2 == 0) {
                          uv_fs_req_cleanup(&close_req);
                          iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file2",0x41,0x180
                                             ,(uv_fs_cb)0x0);
                          if (iVar2 < 0) {
                            pcVar7 = "r >= 0";
                            uVar5 = 0x8e7;
                          }
                          else {
                            uv_fs_req_cleanup(&open_req1);
                            iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,
                                                (uv_file)open_req1.result,(uv_fs_cb)0x0);
                            if (iVar2 == 0) {
                              uv_fs_req_cleanup(&close_req);
                              iVar2 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test_dir_symlink"
                                                    ,0,(uv_fs_cb)0x0);
                              if (iVar2 == 2) {
                                if (scandir_req.result == 2) {
                                  if (scandir_req.ptr == (void *)0x0) {
                                    pcVar7 = "scandir_req.ptr";
                                    uVar5 = 0x8f0;
                                  }
                                  else {
                                    while (iVar2 = uv_fs_scandir_next(&scandir_req,&dent),
                                          pcVar7 = dent.name, iVar2 != -0xfff) {
                                      pcVar6 = "file1";
                                      iVar2 = strcmp(dent.name,"file1");
                                      if (iVar2 != 0) {
                                        pcVar6 = "file2";
                                        iVar2 = strcmp(pcVar7,"file2");
                                        if (iVar2 != 0) {
                                          pcVar7 = 
                                          "strcmp(dent.name, \"file1\") == 0 || strcmp(dent.name, \"file2\") == 0"
                                          ;
                                          uVar5 = 0x8f2;
                                          goto LAB_001233fa;
                                        }
                                      }
                                      dent_00.name = (char *)(ulong)dent.type;
                                      dent_00._8_8_ = pcVar6;
                                      assert_is_file_type(dent_00);
                                    }
                                    uv_fs_req_cleanup(&scandir_req);
                                    if (scandir_req.ptr == (void *)0x0) {
                                      iVar2 = uv_fs_unlink((uv_loop_t *)0x0,&req,"test_dir_symlink",
                                                           (uv_fs_cb)0x0);
                                      if (iVar2 == 0) {
                                        uv_fs_req_cleanup(&req);
                                        iVar2 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,
                                                              "test_dir_symlink",0,(uv_fs_cb)0x0);
                                        if (iVar2 == -2) {
                                          uv_fs_req_cleanup(&scandir_req);
                                          iVar2 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,
                                                                "test_dir",0,(uv_fs_cb)0x0);
                                          if (iVar2 == 2) {
                                            if (scandir_req.result == 2) {
                                              if (scandir_req.ptr == (void *)0x0) {
                                                pcVar7 = "scandir_req.ptr";
                                                uVar5 = 0x904;
                                              }
                                              else {
                                                while (iVar2 = uv_fs_scandir_next(&scandir_req,&dent
                                                                                 ),
                                                      pcVar7 = dent.name, iVar2 != -0xfff) {
                                                  pcVar6 = "file1";
                                                  iVar2 = strcmp(dent.name,"file1");
                                                  if (iVar2 != 0) {
                                                    pcVar6 = "file2";
                                                    iVar2 = strcmp(pcVar7,"file2");
                                                    if (iVar2 != 0) {
                                                      pcVar7 = 
                                                  "strcmp(dent.name, \"file1\") == 0 || strcmp(dent.name, \"file2\") == 0"
                                                  ;
                                                  uVar5 = 0x906;
                                                  goto LAB_001233fa;
                                                  }
                                                  }
                                                  dent_01.name = (char *)(ulong)dent.type;
                                                  dent_01._8_8_ = pcVar6;
                                                  assert_is_file_type(dent_01);
                                                }
                                                uv_fs_req_cleanup(&scandir_req);
                                                if (scandir_req.ptr == (void *)0x0) {
                                                  unlink("test_dir/file1");
                                                  unlink("test_dir/file2");
                                                  rmdir("test_dir");
                                                  rmdir("test_dir_symlink");
                                                  puVar4 = uv_default_loop();
                                                  close_loop(puVar4);
                                                  puVar4 = uv_default_loop();
                                                  iVar2 = uv_loop_close(puVar4);
                                                  if (iVar2 == 0) {
                                                    return 0;
                                                  }
                                                  pcVar7 = "0 == uv_loop_close(uv_default_loop())";
                                                  uVar5 = 0x912;
                                                }
                                                else {
                                                  pcVar7 = "!scandir_req.ptr";
                                                  uVar5 = 0x90a;
                                                }
                                              }
                                            }
                                            else {
                                              pcVar7 = "scandir_req.result == 2";
                                              uVar5 = 0x903;
                                            }
                                          }
                                          else {
                                            pcVar7 = "r == 2";
                                            uVar5 = 0x902;
                                          }
                                        }
                                        else {
                                          pcVar7 = "r == UV_ENOENT";
                                          uVar5 = 0x8fe;
                                        }
                                      }
                                      else {
                                        pcVar7 = "r == 0";
                                        uVar5 = 0x8fa;
                                      }
                                    }
                                    else {
                                      pcVar7 = "!scandir_req.ptr";
                                      uVar5 = 0x8f6;
                                    }
                                  }
                                }
                                else {
                                  pcVar7 = "scandir_req.result == 2";
                                  uVar5 = 0x8ef;
                                }
                              }
                              else {
                                pcVar7 = "r == 2";
                                uVar5 = 0x8ee;
                              }
                            }
                            else {
                              pcVar7 = "r == 0";
                              uVar5 = 0x8ea;
                            }
                          }
                        }
                        else {
                          pcVar7 = "r == 0";
                          uVar5 = 0x8e2;
                        }
                      }
                    }
                    else {
                      pcVar7 = "strcmp(req.ptr, test_dir_abs_buf) == 0";
                      uVar5 = 0x8d9;
                    }
                  }
                  else {
                    pcVar7 = "r == 0";
                    uVar5 = 0x8d4;
                  }
                }
                else {
                  pcVar7 = "strcmp(req.ptr, test_dir) == 0";
                  uVar5 = 0x8c6;
                }
              }
              else {
                pcVar7 = "r == 0";
                uVar5 = 0x8c2;
              }
            }
            else {
              pcVar7 = "((uv_stat_t*)req.ptr)->st_size == strlen(test_dir)";
              uVar5 = 0x8bc;
            }
          }
          else {
            pcVar7 = "r == 0";
            uVar5 = 0x8b0;
          }
        }
      }
      else {
        pcVar7 = "r == 0";
        uVar5 = 0x8ab;
      }
    }
    else {
      pcVar7 = "req.result == 0";
      uVar5 = 0x8a7;
    }
  }
  else {
    pcVar7 = "r == 0";
    uVar5 = 0x8a6;
  }
LAB_001233fa:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar5,pcVar7);
  abort();
}

Assistant:

int test_symlink_dir_impl(int type) {
  uv_fs_t req;
  int r;
  char* test_dir;
  uv_dirent_t dent;
  static char test_dir_abs_buf[PATHMAX];
  size_t test_dir_abs_size;

  /* set-up */
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");
  rmdir("test_dir_symlink");
  test_dir_abs_size = sizeof(test_dir_abs_buf);

  loop = uv_default_loop();

  uv_fs_mkdir(NULL, &req, "test_dir", 0777, NULL);
  uv_fs_req_cleanup(&req);

#ifdef _WIN32
  strcpy(test_dir_abs_buf, "\\\\?\\");
  uv_cwd(test_dir_abs_buf + 4, &test_dir_abs_size);
  test_dir_abs_size += 4;
  strcat(test_dir_abs_buf, "\\test_dir\\");
  test_dir_abs_size += strlen("\\test_dir\\");
  test_dir = test_dir_abs_buf;
#else
  uv_cwd(test_dir_abs_buf, &test_dir_abs_size);
  strcat(test_dir_abs_buf, "/test_dir");
  test_dir_abs_size += strlen("/test_dir");
  test_dir = "test_dir";
#endif

  r = uv_fs_symlink(NULL, &req, test_dir, "test_dir_symlink", type, NULL);
  if (type == UV_FS_SYMLINK_DIR && (r == UV_ENOTSUP || r == UV_EPERM)) {
    uv_fs_req_cleanup(&req);
    RETURN_SKIP("this version of Windows doesn't support unprivileged "
                "creation of directory symlinks");
  }
  fprintf(stderr, "r == %i\n", r);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_stat(NULL, &req, "test_dir_symlink", NULL);
  ASSERT(r == 0);
  ASSERT(((uv_stat_t*)req.ptr)->st_mode & S_IFDIR);
  uv_fs_req_cleanup(&req);

  r = uv_fs_lstat(NULL, &req, "test_dir_symlink", NULL);
  ASSERT(r == 0);
#if defined(__MSYS__)
  RETURN_SKIP("symlink reading is not supported on MSYS2");
#endif
  ASSERT(((uv_stat_t*)req.ptr)->st_mode & S_IFLNK);
#ifdef _WIN32
  ASSERT(((uv_stat_t*)req.ptr)->st_size == strlen(test_dir + 4));
#else
# ifdef __PASE__
  /* On IBMi PASE, st_size returns the length of the symlink itself. */
  ASSERT(((uv_stat_t*)req.ptr)->st_size == strlen("test_dir_symlink"));
# else
  ASSERT(((uv_stat_t*)req.ptr)->st_size == strlen(test_dir));
# endif
#endif
  uv_fs_req_cleanup(&req);

  r = uv_fs_readlink(NULL, &req, "test_dir_symlink", NULL);
  ASSERT(r == 0);
#ifdef _WIN32
  ASSERT(strcmp(req.ptr, test_dir + 4) == 0);
#else
  ASSERT(strcmp(req.ptr, test_dir) == 0);
#endif
  uv_fs_req_cleanup(&req);

  r = uv_fs_realpath(NULL, &req, "test_dir_symlink", NULL);
#ifdef _WIN32
  /*
   * Windows XP and Server 2003 don't support GetFinalPathNameByHandleW()
   */
  if (r == UV_ENOSYS) {
    uv_fs_req_cleanup(&req);
    RETURN_SKIP("realpath is not supported on Windows XP");
  }
#endif
  ASSERT(r == 0);
#ifdef _WIN32
  ASSERT(strlen(req.ptr) == test_dir_abs_size - 5);
  ASSERT(strnicmp(req.ptr, test_dir + 4, test_dir_abs_size - 5) == 0);
#else
  ASSERT(strcmp(req.ptr, test_dir_abs_buf) == 0);
#endif
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(NULL, &open_req1, "test_dir/file1", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&open_req1);
  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_dir/file2", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&open_req1);
  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_scandir(NULL, &scandir_req, "test_dir_symlink", 0, NULL);
  ASSERT(r == 2);
  ASSERT(scandir_req.result == 2);
  ASSERT(scandir_req.ptr);
  while (UV_EOF != uv_fs_scandir_next(&scandir_req, &dent)) {
    ASSERT(strcmp(dent.name, "file1") == 0 || strcmp(dent.name, "file2") == 0);
    assert_is_file_type(dent);
  }
  uv_fs_req_cleanup(&scandir_req);
  ASSERT(!scandir_req.ptr);

  /* unlink will remove the directory symlink */
  r = uv_fs_unlink(NULL, &req, "test_dir_symlink", NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_scandir(NULL, &scandir_req, "test_dir_symlink", 0, NULL);
  ASSERT(r == UV_ENOENT);
  uv_fs_req_cleanup(&scandir_req);

  r = uv_fs_scandir(NULL, &scandir_req, "test_dir", 0, NULL);
  ASSERT(r == 2);
  ASSERT(scandir_req.result == 2);
  ASSERT(scandir_req.ptr);
  while (UV_EOF != uv_fs_scandir_next(&scandir_req, &dent)) {
    ASSERT(strcmp(dent.name, "file1") == 0 || strcmp(dent.name, "file2") == 0);
    assert_is_file_type(dent);
  }
  uv_fs_req_cleanup(&scandir_req);
  ASSERT(!scandir_req.ptr);

  /* clean-up */
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");
  rmdir("test_dir_symlink");

  MAKE_VALGRIND_HAPPY();
  return 0;
}